

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int has_ext(char *ext)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *e;
  int index;
  char *terminator;
  char *loc;
  char *extensions;
  char *ext_local;
  
  if (GLVersion.major < 3) {
    loc = exts;
    if ((exts == (char *)0x0) || (ext == (char *)0x0)) {
      ext_local._4_4_ = 0;
    }
    else {
      do {
        pcVar2 = strstr(loc,ext);
        if (pcVar2 == (char *)0x0) {
          return 0;
        }
        sVar3 = strlen(ext);
        pcVar4 = pcVar2 + sVar3;
      } while (((pcVar2 != loc) && (loc = pcVar4, pcVar2[-1] != ' ')) ||
              ((*pcVar4 != ' ' && (loc = pcVar4, *pcVar4 != '\0'))));
      ext_local._4_4_ = 1;
    }
  }
  else {
    for (e._4_4_ = 0; e._4_4_ < num_exts_i; e._4_4_ = e._4_4_ + 1) {
      iVar1 = strcmp(exts_i[e._4_4_],ext);
      if (iVar1 == 0) {
        return 1;
      }
    }
    ext_local._4_4_ = 0;
  }
  return ext_local._4_4_;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(GLVersion.major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}